

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNewLineStyle.cxx
# Opt level: O0

string * __thiscall
cmNewLineStyle::GetCharacters_abi_cxx11_(string *__return_storage_ptr__,cmNewLineStyle *this)

{
  Style SVar1;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  cmNewLineStyle *local_18;
  cmNewLineStyle *this_local;
  
  SVar1 = this->NewLineStyle;
  local_18 = this;
  this_local = (cmNewLineStyle *)__return_storage_ptr__;
  if (SVar1 == Invalid) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else if (SVar1 == LF) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\n",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else if (SVar1 == CRLF) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"\r\n",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string cmNewLineStyle::GetCharacters() const
{
  switch (NewLineStyle) {
    case Invalid:
      return "";
    case LF:
      return "\n";
    case CRLF:
      return "\r\n";
  }
  return "";
}